

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

int bit_encode_write_cw(bit_encode_t *be,uint32 codeword,int nbits)

{
  int iVar1;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  int local_18;
  uchar bits [4];
  int nbits_local;
  uint32 codeword_local;
  bit_encode_t *be_local;
  
  bits = (uchar  [4])(codeword << (0x20U - (char)nbits & 0x1f));
  local_1c = bits[3];
  local_1b = bits[2];
  local_1a = bits[1];
  local_19 = bits[0];
  local_18 = nbits;
  iVar1 = bit_encode_write(be,&local_1c,nbits);
  return iVar1;
}

Assistant:

int
bit_encode_write_cw(bit_encode_t *be, uint32 codeword, int nbits)
{
    unsigned char bits[4];
    codeword <<= (32 - nbits);
    bits[0] = (codeword >> 24) & 0xff;
    bits[1] = (codeword >> 16) & 0xff;
    bits[2] = (codeword >> 8) & 0xff;
    bits[3] = codeword & 0xff;
    return bit_encode_write(be, bits, nbits);
}